

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-decoder.c
# Opt level: O3

int mg_session_read_init_message(mg_session *session,mg_message_init **message)

{
  int iVar1;
  mg_message_init *pmVar2;
  mg_string *client_name;
  mg_map *auth_token;
  mg_string *local_28;
  mg_map *local_20;
  
  iVar1 = mg_session_read_string(session,&local_28);
  if (iVar1 == 0) {
    iVar1 = mg_session_read_map(session,&local_20);
    if (iVar1 == 0) {
      pmVar2 = (mg_message_init *)mg_allocator_malloc(session->decoder_allocator,0x10);
      if (pmVar2 != (mg_message_init *)0x0) {
        pmVar2->client_name = local_28;
        pmVar2->auth_token = local_20;
        *message = pmVar2;
        return 0;
      }
      mg_map_destroy_ca(local_20,session->decoder_allocator);
      iVar1 = -3;
    }
    else {
      mg_string_destroy_ca(local_28,session->decoder_allocator);
    }
    mg_string_destroy_ca(local_28,session->decoder_allocator);
  }
  return iVar1;
}

Assistant:

int mg_session_read_init_message(mg_session *session,
                                 mg_message_init **message) {
  mg_string *client_name;
  MG_RETURN_IF_FAILED(mg_session_read_string(session, &client_name));

  int status = 0;

  mg_map *auth_token;
  status = mg_session_read_map(session, &auth_token);
  if (status != 0) {
    mg_string_destroy_ca(client_name, session->decoder_allocator);
    goto cleanup_client_name;
  }

  mg_message_init *tmessage =
      mg_allocator_malloc(session->decoder_allocator, sizeof(mg_message_init));
  if (!tmessage) {
    status = MG_ERROR_OOM;
    goto cleanup;
  }

  tmessage->client_name = client_name;
  tmessage->auth_token = auth_token;
  *message = tmessage;
  return 0;

cleanup:
  mg_map_destroy_ca(auth_token, session->decoder_allocator);

cleanup_client_name:
  mg_string_destroy_ca(client_name, session->decoder_allocator);
  return status;
}